

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quicly.c
# Opt level: O0

int update_traffic_key_cb
              (ptls_update_traffic_key_t *self,ptls_t *tls,int is_enc,size_t epoch,void *secret)

{
  quicly_conn_t *conn_00;
  char *pcVar1;
  size_t sVar2;
  _func_void_st_ptls_log_event_t_ptr_ptls_t_ptr_char_ptr_char_ptr_varargs *p_Var3;
  st_ptls_log_event_t *psVar4;
  size_t __n;
  long lVar5;
  int iVar6;
  void **ppvVar7;
  ptls_context_t *ppVar8;
  ptls_cipher_suite_t *ppVar9;
  char *buf;
  undefined8 uStack_180;
  char acStack_178 [8];
  anon_struct_32_2_dc10f4a0_for_cipher *local_170;
  anon_struct_32_2_dc10f4a0_for_cipher *local_168;
  undefined8 uStack_160;
  size_t local_158;
  undefined8 local_150;
  int64_t local_148;
  int local_13c;
  char *local_138;
  undefined1 local_129;
  size_t local_128;
  size_t size;
  uint8_t *secret_store;
  char hexbuf [129];
  size_t _l;
  quicly_conn_t *_conn;
  char *log_label;
  int ret;
  ptls_aead_context_t **aead_slot;
  ptls_cipher_context_t **hp_slot;
  ptls_cipher_suite_t *cipher;
  ptls_context_t *tlsctx;
  quicly_conn_t *conn;
  void *secret_local;
  size_t epoch_local;
  int is_enc_local;
  ptls_t *tls_local;
  ptls_update_traffic_key_t *self_local;
  
  uStack_180 = 0x142be7;
  ppvVar7 = ptls_get_data_ptr(tls);
  conn_00 = (quicly_conn_t *)*ppvVar7;
  uStack_180 = 0x142bf7;
  ppVar8 = ptls_get_context(tls);
  uStack_180 = 0x142c04;
  ppVar9 = ptls_get_cipher(tls);
  uStack_180 = 0x142c11;
  iVar6 = ptls_is_server(tls);
  pcVar1 = update_traffic_key_cb::log_labels[(int)(uint)(iVar6 == is_enc)][epoch];
  buf = acStack_178;
  if (quicly_trace_fp != (FILE *)0x0) {
    uStack_180 = 0x142c74;
    iVar6 = ptls_skip_tracing((conn_00->crypto).tls);
    buf = acStack_178;
    if (iVar6 == 0) {
      local_148 = (conn_00->stash).now;
      secret_local._0_1_ = (undefined1)epoch;
      local_129 = secret_local._0_1_;
      sVar2 = ppVar9->hash->digest_size;
      lVar5 = -(sVar2 * 2 + 0x10 & 0xfffffffffffffff0);
      buf = acStack_178 + lVar5;
      local_150 = conn_00;
      local_13c = is_enc;
      local_138 = pcVar1;
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x142cea;
      ptls_hexdump(buf,secret,sVar2);
      *(undefined8 *)((long)&uStack_180 + lVar5) = 0x142d1e;
      QUICLY_CRYPTO_UPDATE_SECRET
                (*(st_quicly_conn_t **)(&stack0xfffffffffffffec0 + lVar5),
                 *(int64_t *)(&stack0xfffffffffffffec0 + lVar5 + -8),
                 *(int *)((long)&local_150 + lVar5 + 4),*(uint8_t *)((long)&local_150 + lVar5 + 3),
                 *(char **)((long)&local_158 + lVar5),*(char **)((long)&uStack_160 + lVar5));
    }
  }
  if (ppVar8->log_event != (ptls_log_event_t *)0x0) {
    sVar2 = ppVar9->hash->digest_size;
    builtin_strncpy(buf + -8,"J-\x14",4);
    buf[-4] = '\0';
    buf[-3] = '\0';
    buf[-2] = '\0';
    buf[-1] = '\0';
    ptls_hexdump((char *)&secret_store,secret,sVar2);
    p_Var3 = ppVar8->log_event->cb;
    psVar4 = ppVar8->log_event;
    builtin_strncpy(buf + -8,"~-\x14",4);
    buf[-4] = '\0';
    buf[-3] = '\0';
    buf[-2] = '\0';
    buf[-1] = '\0';
    (*p_Var3)(psVar4,tls,pcVar1,"%s",&secret_store);
  }
  local_158 = epoch;
  if (epoch == 1) {
    uStack_160._4_4_ = is_enc;
    buf[-8] = -0x34;
    buf[-7] = '-';
    buf[-6] = '\x14';
    buf[-5] = '\0';
    buf[-4] = '\0';
    buf[-3] = '\0';
    buf[-2] = '\0';
    buf[-1] = '\0';
    iVar6 = quicly_is_client(conn_00);
    if (uStack_160._4_4_ != iVar6) {
      buf[-8] = -7;
      buf[-7] = '-';
      buf[-6] = '\x14';
      buf[-5] = '\0';
      buf[-4] = '\0';
      buf[-3] = '\0';
      buf[-2] = '\0';
      buf[-1] = '\0';
      __assert_fail("is_enc == quicly_is_client(conn)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x101b,
                    "int update_traffic_key_cb(ptls_update_traffic_key_t *, ptls_t *, int, size_t, const void *)"
                   );
    }
    if (conn_00->application == (st_quicly_application_space_t *)0x0) {
      builtin_strncpy(buf + -8,"\x10.\x14",4);
      buf[-4] = '\0';
      buf[-3] = '\0';
      buf[-2] = '\0';
      buf[-1] = '\0';
      iVar6 = setup_application_space(*(quicly_conn_t **)buf);
      if (iVar6 != 0) {
        return iVar6;
      }
    }
  }
  else if (epoch == 2) {
    if (conn_00->handshake == (st_quicly_handshake_space_t *)0x0) {
      buf[-8] = -0x52;
      buf[-7] = '.';
      buf[-6] = '\x14';
      buf[-5] = '\0';
      buf[-4] = '\0';
      buf[-3] = '\0';
      buf[-2] = '\0';
      buf[-1] = '\0';
      iVar6 = setup_handshake_space_and_flow(*(quicly_conn_t **)(buf + 0x10),*(size_t *)(buf + 8));
      if (iVar6 != 0) {
        return iVar6;
      }
    }
    if (is_enc == 0) {
      local_168 = &conn_00->handshake->cipher;
      local_170 = &conn_00->handshake->cipher;
    }
    else {
      local_168 = (anon_struct_32_2_dc10f4a0_for_cipher *)&(conn_00->handshake->cipher).egress;
      local_170 = (anon_struct_32_2_dc10f4a0_for_cipher *)&(conn_00->handshake->cipher).egress;
    }
  }
  else {
    if (epoch != 3) {
      buf[-8] = -0x50;
      buf[-7] = '0';
      buf[-6] = '\x14';
      buf[-5] = '\0';
      buf[-4] = '\0';
      buf[-3] = '\0';
      buf[-2] = '\0';
      buf[-1] = '\0';
      __assert_fail("!\"logic flaw\"",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                    ,0x103e,
                    "int update_traffic_key_cb(ptls_update_traffic_key_t *, ptls_t *, int, size_t, const void *)"
                   );
    }
    if (is_enc != 0) {
      builtin_strncpy(buf + -8,"a/\x14",4);
      buf[-4] = '\0';
      buf[-3] = '\0';
      buf[-2] = '\0';
      buf[-1] = '\0';
      iVar6 = apply_remote_transport_params(*(quicly_conn_t **)buf);
      if (iVar6 != 0) {
        return iVar6;
      }
    }
    if (conn_00->application == (st_quicly_application_space_t *)0x0) {
      buf[-8] = -0x73;
      buf[-7] = '/';
      buf[-6] = '\x14';
      buf[-5] = '\0';
      buf[-4] = '\0';
      buf[-3] = '\0';
      buf[-2] = '\0';
      buf[-1] = '\0';
      iVar6 = setup_application_space(*(quicly_conn_t **)buf);
      if (iVar6 != 0) {
        return iVar6;
      }
    }
    if (is_enc == 0) {
      size = (size_t)(conn_00->application->cipher).ingress.secret;
    }
    else {
      if ((conn_00->application->cipher).egress.key.aead != (ptls_aead_context_t *)0x0) {
        buf[-8] = -0x29;
        buf[-7] = '/';
        buf[-6] = '\x14';
        buf[-5] = '\0';
        buf[-4] = '\0';
        buf[-3] = '\0';
        buf[-2] = '\0';
        buf[-1] = '\0';
        dispose_cipher(*(st_quicly_cipher_context_t **)(buf + -8));
      }
      size = (size_t)(conn_00->application->cipher).egress.secret;
    }
    sVar2 = size;
    __n = ppVar9->hash->digest_size;
    buf[-8] = -0x71;
    buf[-7] = '0';
    buf[-6] = '\x14';
    buf[-5] = '\0';
    buf[-4] = '\0';
    buf[-3] = '\0';
    buf[-2] = '\0';
    buf[-1] = '\0';
    memcpy((void *)sVar2,secret,__n);
  }
  *(ptls_hash_algorithm_t **)(buf + -0x10) = ppVar9->hash;
  *(void **)(buf + -8) = secret;
  buf[-0x18] = -0x17;
  buf[-0x17] = '0';
  buf[-0x16] = '\x14';
  buf[-0x15] = '\0';
  buf[-0x14] = '\0';
  buf[-0x13] = '\0';
  buf[-0x12] = '\0';
  buf[-0x11] = '\0';
  self_local._4_4_ =
       setup_cipher(*(quicly_conn_t **)(buf + 0x40),*(size_t *)(buf + 0x38),*(int *)(buf + 0x34),
                    *(ptls_cipher_context_t ***)(buf + 0x28),*(ptls_aead_context_t ***)(buf + 0x20),
                    *(ptls_aead_algorithm_t **)(buf + 0x18),*(ptls_hash_algorithm_t **)(buf + 0x58),
                    *(void **)(buf + 0x60));
  if (self_local._4_4_ == 0) {
    if ((epoch == 3) && (is_enc != 0)) {
      conn_00->application->one_rtt_writable = 1;
      builtin_strncpy(buf + -8,"81\x14",4);
      buf[-4] = '\0';
      buf[-3] = '\0';
      buf[-2] = '\0';
      buf[-1] = '\0';
      open_blocked_streams(*(quicly_conn_t **)(buf + 0x28),*(int *)(buf + 0x24));
      builtin_strncpy(buf + -8,"C1\x14",4);
      buf[-4] = '\0';
      buf[-3] = '\0';
      buf[-2] = '\0';
      buf[-1] = '\0';
      open_blocked_streams(*(quicly_conn_t **)(buf + 0x28),*(int *)(buf + 0x24));
      builtin_strncpy(buf + -8,"L1\x14",4);
      buf[-4] = '\0';
      buf[-3] = '\0';
      buf[-2] = '\0';
      buf[-1] = '\0';
      iVar6 = quicly_is_client(conn_00);
      if ((iVar6 == 0) &&
         (((conn_00->super).ctx)->generate_resumption_token !=
          (quicly_generate_resumption_token_t *)0x0)) {
        builtin_strncpy(buf + -8,"k1\x14",4);
        buf[-4] = '\0';
        buf[-3] = '\0';
        buf[-2] = '\0';
        buf[-1] = '\0';
        iVar6 = quicly_send_resumption_token(conn_00);
        if (iVar6 != 0) {
          buf[-8] = -0x6b;
          buf[-7] = '1';
          buf[-6] = '\x14';
          buf[-5] = '\0';
          buf[-4] = '\0';
          buf[-3] = '\0';
          buf[-2] = '\0';
          buf[-1] = '\0';
          __assert_fail("ret == 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/jordicenzano[P]quicly/lib/quicly.c"
                        ,0x104f,
                        "int update_traffic_key_cb(ptls_update_traffic_key_t *, ptls_t *, int, size_t, const void *)"
                       );
        }
      }
      buf[-8] = -0x60;
      buf[-7] = '1';
      buf[-6] = '\x14';
      buf[-5] = '\0';
      buf[-4] = '\0';
      buf[-3] = '\0';
      buf[-2] = '\0';
      buf[-1] = '\0';
      local_128 = local_cid_size(conn_00);
      buf[-8] = -0x45;
      buf[-7] = '1';
      buf[-6] = '\x14';
      buf[-5] = '\0';
      buf[-4] = '\0';
      buf[-3] = '\0';
      buf[-2] = '\0';
      buf[-1] = '\0';
      iVar6 = quicly_local_cid_set_size
                        (*(quicly_local_cid_set_t **)(buf + 0x18),*(size_t *)(buf + 0x10));
      if (iVar6 != 0) {
        (conn_00->egress).pending_flows = (conn_00->egress).pending_flows | 0x80;
      }
    }
    self_local._4_4_ = 0;
  }
  return self_local._4_4_;
}

Assistant:

static int update_traffic_key_cb(ptls_update_traffic_key_t *self, ptls_t *tls, int is_enc, size_t epoch, const void *secret)
{
    quicly_conn_t *conn = *ptls_get_data_ptr(tls);
    ptls_context_t *tlsctx = ptls_get_context(tls);
    ptls_cipher_suite_t *cipher = ptls_get_cipher(tls);
    ptls_cipher_context_t **hp_slot;
    ptls_aead_context_t **aead_slot;
    int ret;
    static const char *log_labels[2][4] = {
        {NULL, "CLIENT_EARLY_TRAFFIC_SECRET", "CLIENT_HANDSHAKE_TRAFFIC_SECRET", "CLIENT_TRAFFIC_SECRET_0"},
        {NULL, NULL, "SERVER_HANDSHAKE_TRAFFIC_SECRET", "SERVER_TRAFFIC_SECRET_0"}};
    const char *log_label = log_labels[ptls_is_server(tls) == is_enc][epoch];

    QUICLY_PROBE(CRYPTO_UPDATE_SECRET, conn, conn->stash.now, is_enc, epoch, log_label,
                 QUICLY_PROBE_HEXDUMP(secret, cipher->hash->digest_size));

    if (tlsctx->log_event != NULL) {
        char hexbuf[PTLS_MAX_DIGEST_SIZE * 2 + 1];
        ptls_hexdump(hexbuf, secret, cipher->hash->digest_size);
        tlsctx->log_event->cb(tlsctx->log_event, tls, log_label, "%s", hexbuf);
    }

#define SELECT_CIPHER_CONTEXT(p)                                                                                                   \
    do {                                                                                                                           \
        hp_slot = &(p)->header_protection;                                                                                         \
        aead_slot = &(p)->aead;                                                                                                    \
    } while (0)

    switch (epoch) {
    case QUICLY_EPOCH_0RTT:
        assert(is_enc == quicly_is_client(conn));
        if (conn->application == NULL && (ret = setup_application_space(conn)) != 0)
            return ret;
        if (is_enc) {
            SELECT_CIPHER_CONTEXT(&conn->application->cipher.egress.key);
        } else {
            hp_slot = &conn->application->cipher.ingress.header_protection.zero_rtt;
            aead_slot = &conn->application->cipher.ingress.aead[1];
        }
        break;
    case QUICLY_EPOCH_HANDSHAKE:
        if (conn->handshake == NULL && (ret = setup_handshake_space_and_flow(conn, QUICLY_EPOCH_HANDSHAKE)) != 0)
            return ret;
        SELECT_CIPHER_CONTEXT(is_enc ? &conn->handshake->cipher.egress : &conn->handshake->cipher.ingress);
        break;
    case QUICLY_EPOCH_1RTT: {
        if (is_enc)
            if ((ret = apply_remote_transport_params(conn)) != 0)
                return ret;
        if (conn->application == NULL && (ret = setup_application_space(conn)) != 0)
            return ret;
        uint8_t *secret_store;
        if (is_enc) {
            if (conn->application->cipher.egress.key.aead != NULL)
                dispose_cipher(&conn->application->cipher.egress.key);
            SELECT_CIPHER_CONTEXT(&conn->application->cipher.egress.key);
            secret_store = conn->application->cipher.egress.secret;
        } else {
            hp_slot = &conn->application->cipher.ingress.header_protection.one_rtt;
            aead_slot = &conn->application->cipher.ingress.aead[0];
            secret_store = conn->application->cipher.ingress.secret;
        }
        memcpy(secret_store, secret, cipher->hash->digest_size);
    } break;
    default:
        assert(!"logic flaw");
        break;
    }

#undef SELECT_CIPHER_CONTEXT

    if ((ret = setup_cipher(conn, epoch, is_enc, hp_slot, aead_slot, cipher->aead, cipher->hash, secret)) != 0)
        return ret;

    if (epoch == QUICLY_EPOCH_1RTT && is_enc) {
        /* update states now that we have 1-RTT write key */
        conn->application->one_rtt_writable = 1;
        open_blocked_streams(conn, 1);
        open_blocked_streams(conn, 0);
        /* send the first resumption token using the 0.5 RTT window */
        if (!quicly_is_client(conn) && conn->super.ctx->generate_resumption_token != NULL) {
            ret = quicly_send_resumption_token(conn);
            assert(ret == 0);
        }

        /* schedule NEW_CONNECTION_IDs */
        size_t size = local_cid_size(conn);
        if (quicly_local_cid_set_size(&conn->super.local.cid_set, size))
            conn->egress.pending_flows |= QUICLY_PENDING_FLOW_CID_FRAME_BIT;
    }

    return 0;
}